

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureglyphcache.cpp
# Opt level: O3

void load_glyph_image_to_texture(QOpenGLContext *ctx,QImage *img,GLuint texture,int tx,int ty)

{
  uint uVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long *plVar9;
  long lVar10;
  undefined8 uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  long in_FS_OFFSET;
  QImage local_70 [16];
  undefined8 local_60;
  code *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar9 = (long *)QOpenGLContext::functions();
  uVar4 = QImage::width();
  iVar5 = QImage::height();
  iVar6 = QImage::format();
  if (iVar6 == 1) {
    QImage::convertToFormat_helper(local_70,img,0x18,0);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (code *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
    uVar11 = local_60;
    local_58 = QTextStream::operator<<;
    local_60 = 0;
    local_48 = *(undefined1 **)(img + 0x10);
    *(undefined8 *)(img + 0x10) = uVar11;
    QImage::~QImage((QImage *)&local_58);
    QImage::~QImage(local_70);
  }
  else {
    iVar6 = QImage::depth();
    if (iVar6 == 0x20) {
      iVar6 = QImage::format();
      if (iVar6 == 4) {
        if (iVar5 < 1) goto LAB_0016299c;
      }
      else {
        iVar6 = QImage::format();
        if ((iVar6 != 6) || (bVar2 = QOpenGLContext::isOpenGLES(), (bVar2 & 0 < iVar5) == 0))
        goto LAB_0016299c;
      }
      iVar6 = 0;
      do {
        lVar10 = QImage::scanLine((int)img);
        if (0 < (int)uVar4) {
          uVar13 = 0;
          do {
            uVar1 = *(uint *)(lVar10 + uVar13 * 4);
            uVar12 = uVar1 >> 0x10 & 0xff;
            uVar14 = uVar1 >> 8 & 0xff;
            iVar7 = QImage::format();
            if (iVar7 == 4) {
              uVar8 = (uVar14 + (uVar1 & 0xff) + uVar12) * 0x5556 + 0x5556 >> 0x10;
            }
            else {
              uVar8 = (uint)*(byte *)(lVar10 + 3 + uVar13 * 4);
            }
            *(uint *)(lVar10 + uVar13 * 4) =
                 uVar14 << 8 | uVar12 << 0x10 | uVar8 << 0x18 | uVar1 & 0xff;
            cVar3 = QOpenGLContext::isOpenGLES();
            if (cVar3 != '\0') {
              uVar1 = *(uint *)(lVar10 + uVar13 * 4);
              uVar12 = uVar1 & 0xff00ff;
              *(uint *)(lVar10 + uVar13 * 4) = uVar12 >> 0x10 | uVar12 << 0x10 | uVar1 & 0xff00ff00;
            }
            uVar13 = uVar13 + 1;
          } while (uVar4 != uVar13);
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 != iVar5);
    }
  }
LAB_0016299c:
  (**(code **)*plVar9)(0xde1,texture);
  iVar6 = QImage::depth();
  if (iVar6 == 0x20) {
    cVar3 = QOpenGLContext::isOpenGLES();
    iVar6 = 0x80e1;
    if (cVar3 != '\0') {
      iVar6 = 0x1908;
    }
  }
  else {
    QOpenGLContext::currentContext();
    QOpenGLContext::format();
    iVar6 = QSurfaceFormat::profile();
    QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_58);
    iVar6 = (uint)(iVar6 != 1) * 3 + 0x1903;
  }
  uVar11 = QImage::constBits();
  (**(code **)(*plVar9 + 0x168))(0xde1,0,tx,ty,uVar4,iVar5,iVar6,0x1401,uVar11);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void load_glyph_image_to_texture(QOpenGLContext *ctx,
                                        QImage &img,
                                        GLuint texture,
                                        int tx, int ty)
{
    QOpenGLFunctions *funcs = ctx->functions();

    const int imgWidth = img.width();
    const int imgHeight = img.height();

    if (img.format() == QImage::Format_Mono) {
        img = img.convertToFormat(QImage::Format_Grayscale8);
    } else if (img.depth() == 32) {
        if (img.format() == QImage::Format_RGB32
            // We need to make the alpha component equal to the average of the RGB values.
            // This is needed when drawing sub-pixel antialiased text on translucent targets.
#if Q_BYTE_ORDER == Q_BIG_ENDIAN
            || img.format() == QImage::Format_ARGB32_Premultiplied
#else
            || (img.format() == QImage::Format_ARGB32_Premultiplied
                && ctx->isOpenGLES())
#endif
            ) {
            for (int y = 0; y < imgHeight; ++y) {
                QRgb *src = (QRgb *) img.scanLine(y);
                for (int x = 0; x < imgWidth; ++x) {
                    int r = qRed(src[x]);
                    int g = qGreen(src[x]);
                    int b = qBlue(src[x]);
                    int avg;
                    if (img.format() == QImage::Format_RGB32)
                        avg = (r + g + b + 1) / 3; // "+1" for rounding.
                    else // Format_ARGB_Premultiplied
                        avg = qAlpha(src[x]);

                    src[x] = qRgba(r, g, b, avg);
                    // swizzle the bits to accommodate for the GL_RGBA upload.
#if Q_BYTE_ORDER != Q_BIG_ENDIAN
                    if (ctx->isOpenGLES())
#endif
                        src[x] = ARGB2RGBA(src[x]);
                }
            }
        }
    }

    funcs->glBindTexture(GL_TEXTURE_2D, texture);
    if (img.depth() == 32) {
#if QT_CONFIG(opengles2)
        GLenum fmt = GL_RGBA;
#else
        GLenum fmt = ctx->isOpenGLES() ? GL_RGBA : GL_BGRA;
#endif // QT_CONFIG(opengles2)

#if Q_BYTE_ORDER == Q_BIG_ENDIAN
        fmt = GL_RGBA;
#endif
        funcs->glTexSubImage2D(GL_TEXTURE_2D, 0, tx, ty, imgWidth, imgHeight, fmt, GL_UNSIGNED_BYTE, img.constBits());
    } else {
        // The scanlines in image are 32-bit aligned, even for mono or 8-bit formats. This
        // is good because it matches the default of 4 bytes for GL_UNPACK_ALIGNMENT.
#if !QT_CONFIG(opengles2)
        const GLenum format = isCoreProfile() ? GL_RED : GL_ALPHA;
#else
        const GLenum format = GL_ALPHA;
#endif
        funcs->glTexSubImage2D(GL_TEXTURE_2D, 0, tx, ty, imgWidth, imgHeight, format, GL_UNSIGNED_BYTE, img.constBits());
    }
}